

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_e2ed01::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,cm_curl_off_t value,cm_curl_off_t total,string *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  string sStack_38;
  
  if (total < 1) {
    return false;
  }
  lVar1 = this->CurrentPercentage;
  lVar2 = lround(((double)value / (double)total) * 100.0);
  lVar3 = 100;
  if (lVar2 < 100) {
    lVar3 = lVar2;
  }
  this->CurrentPercentage = lVar3;
  bVar4 = lVar1 != lVar3;
  if (bVar4) {
    cmStrCat<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],long&,char_const(&)[12]>
              (&sStack_38,(char (*) [2])0x70d214,&this->Text,(char (*) [2])0x714bd6,
               &this->CurrentPercentage,(char (*) [12])"% complete]");
    std::__cxx11::string::operator=((string *)status,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return bVar4;
}

Assistant:

bool UpdatePercentage(cm_curl_off_t value, cm_curl_off_t total,
                        std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0) {
      this->CurrentPercentage = std::lround(
        static_cast<double>(value) / static_cast<double>(total) * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }